

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall LazyBailOutRecord::Dump(LazyBailOutRecord *this,FunctionBody *functionBody)

{
  OpCode op;
  int iVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  uint uVar4;
  uint32 uVar5;
  undefined4 extraout_var;
  char16 *pcVar6;
  FunctionBody *functionBody_local;
  LazyBailOutRecord *this_local;
  
  iVar1 = (*(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
  uVar2 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  LVar3 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
  uVar4 = Js::FunctionProxy::GetFunctionNumber((FunctionProxy *)functionBody);
  Output::Print(L"Function %s (#%d.%u, #%u) ",CONCAT44(extraout_var,iVar1),(ulong)uVar2,(ulong)LVar3
                ,(ulong)uVar4);
  uVar5 = BailOutRecord::GetBailOutOffset(this->bailOutRecord);
  op = BailOutRecord::GetBailOutOpCode(this->bailOutRecord);
  pcVar6 = Js::OpCodeUtil::GetOpCodeName(op);
  Output::Print(L"Bytecode Offset: #%04x opcode: %s",(ulong)uVar5,pcVar6);
  return;
}

Assistant:

void LazyBailOutRecord::Dump(Js::FunctionBody* functionBody) const
{
    OUTPUT_PRINT(functionBody);
    Output::Print(_u("Bytecode Offset: #%04x opcode: %s"), this->bailOutRecord->GetBailOutOffset(), Js::OpCodeUtil::GetOpCodeName(this->bailOutRecord->GetBailOutOpCode()));
}